

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

int asm_isk32(ASMState *as,IRRef ref,int32_t *k)

{
  IRIns *pIVar1;
  IRIns *ir;
  int32_t *k_local;
  IRRef ref_local;
  ASMState *as_local;
  
  if (ref < 0x8000) {
    pIVar1 = as->ir + ref;
    if (((pIVar1->field_1).o == '\x1b') ||
       ((0x605fd9U >> ((pIVar1->field_1).t.irt & 0x1f) & 1) == 0)) {
      *k = (pIVar1->field_1).op12;
      return 1;
    }
    if (pIVar1[1] == (IRIns)(long)pIVar1[1].i) {
      *k = pIVar1[1].i;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int asm_isk32(ASMState *as, IRRef ref, int32_t *k)
{
  if (irref_isk(ref)) {
    IRIns *ir = IR(ref);
#if LJ_GC64
    if (ir->o == IR_KNULL || !irt_is64(ir->t)) {
      *k = ir->i;
      return 1;
    } else if (checki32((int64_t)ir_k64(ir)->u64)) {
      *k = (int32_t)ir_k64(ir)->u64;
      return 1;
    }
#else
    if (ir->o != IR_KINT64) {
      *k = ir->i;
      return 1;
    } else if (checki32((int64_t)ir_kint64(ir)->u64)) {
      *k = (int32_t)ir_kint64(ir)->u64;
      return 1;
    }
#endif
  }
  return 0;
}